

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::namespace_uri(xpath_node *node)

{
  xml_attribute_struct *pxVar1;
  char *pcVar2;
  xml_attribute xVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  xml_node p;
  xml_node_struct *pxVar7;
  char_t *__s;
  namespace_uri_predicate pred;
  namespace_uri_predicate pred_00;
  
  pxVar1 = (node->_attribute)._attr;
  if (pxVar1 == (xml_attribute_struct *)0x0) {
    pxVar7 = (node->_node)._root;
    pcVar5 = "";
    pcVar2 = "";
    if (pxVar7 != (xml_node_struct *)0x0) {
      pcVar2 = "";
      if (pxVar7->name != (char_t *)0x0) {
        pcVar2 = pxVar7->name;
      }
    }
    pcVar4 = strchr(pcVar2,0x3a);
    sVar6 = (long)pcVar4 - (long)pcVar2;
    if (pcVar4 == (char *)0x0) {
      sVar6 = 0;
      pcVar2 = (char *)0x0;
    }
    for (; pxVar7 != (xml_node_struct *)0x0; pxVar7 = pxVar7->parent) {
      pred_00.prefix_length = sVar6;
      pred_00.prefix = pcVar2;
      xVar3 = xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
                        ((xml_node *)pxVar7,pred_00);
      if (xVar3._attr != (xml_attribute_struct *)0x0) goto LAB_00123da8;
    }
  }
  else {
    pxVar7 = (node->_node)._root;
    __s = pxVar1->name;
    pcVar5 = "";
    if (__s == (char_t *)0x0) {
      __s = "";
    }
    pcVar2 = strchr(__s,0x3a);
    sVar6 = (long)pcVar2 - (long)__s;
    if (pcVar2 == (char *)0x0) {
      sVar6 = 0;
      __s = (char *)0x0;
    }
    if (pxVar7 != (xml_node_struct *)0x0 && pcVar2 != (char *)0x0) {
      do {
        pred.prefix_length = sVar6;
        pred.prefix = __s;
        xVar3 = xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
                          ((xml_node *)pxVar7,pred);
        if (xVar3._attr != (xml_attribute_struct *)0x0) {
LAB_00123da8:
          if ((xVar3._attr)->value == (char_t *)0x0) {
            return "";
          }
          return (xVar3._attr)->value;
        }
        pxVar7 = pxVar7->parent;
      } while (pxVar7 != (xml_node_struct *)0x0);
    }
  }
  return pcVar5;
}

Assistant:

PUGI__FN xml_attribute xpath_node::attribute() const
	{
		return _attribute;
	}